

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::FunctionDefinition::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionDefinition *this,int level)

{
  pointer puVar1;
  FunctionArgument *pFVar2;
  Block *pBVar3;
  long lVar4;
  string *psVar5;
  ostream *poVar6;
  unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
  *argument;
  pointer puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  long local_1c8;
  string *local_1c0;
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)level);
  std::operator+(&bStack_208,&local_1e8,"FunctionDefinition ");
  local_1c8 = (long)level;
  local_1c0 = __return_storage_ptr__;
  poVar6 = std::operator<<(local_1a8,(string *)&bStack_208);
  poVar6 = std::operator<<(poVar6,(string *)&this->name);
  poVar6 = std::operator<<(poVar6," {");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&bStack_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  puVar1 = (this->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (this->arguments).
                super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    pFVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl;
    (**(code **)((long)(pFVar2->super_ASTElement)._vptr_ASTElement + 0x18))
              (&bStack_208,pFVar2,level + 1);
    poVar6 = std::operator<<(local_1a8,(string *)&bStack_208);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&bStack_208);
  }
  pBVar3 = (this->body)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
           .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pBVar3->super_Expression).super_Statement + 0x18))
            (&bStack_208,pBVar3,level + 1);
  poVar6 = std::operator<<(local_1a8,(string *)&bStack_208);
  psVar5 = local_1c0;
  lVar4 = local_1c8;
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&bStack_208);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1e8,(char)lVar4);
  std::operator+(&bStack_208,&local_1e8,"}");
  poVar6 = std::operator<<(local_1a8,(string *)&bStack_208);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&bStack_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return psVar5;
}

Assistant:

std::string ninx::parser::element::FunctionDefinition::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "FunctionDefinition " << this->name << " {" << std::endl;
    for (auto& argument : arguments) {
        s << argument->dump(level+1) << std::endl;
    }
    s << body->dump(level+1) << std::endl;
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}